

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-attr.cpp
# Opt level: O1

bool __thiscall yactfr::internal::TsdlAttr::boolEquiv(TsdlAttr *this)

{
  string *psVar1;
  string msg;
  int iVar2;
  ostream *poVar3;
  ostringstream ss;
  undefined8 in_stack_fffffffffffffe50;
  TextLocation in_stack_fffffffffffffe58;
  ostringstream local_190 [376];
  
  if (this->kind == Ident) {
    psVar1 = &this->strVal;
    iVar2 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar2 == 0) {
      return true;
    }
    iVar2 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar2 == 0) {
      return true;
    }
    iVar2 = std::__cxx11::string::compare((char *)psVar1);
    if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)psVar1), iVar2 == 0)) {
      return false;
    }
  }
  else if (this->kind == UInt) {
    if (this->uintVal == 1) {
      return true;
    }
    if (this->uintVal == 0) {
      return false;
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Expecting `0`, `false`, `FALSE`, `1`, `true`, or `TRUE` for `",
             0x3d);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(this->name)._M_dataplus._M_p,
                      (this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"` attribute.",0xc);
  std::__cxx11::stringbuf::str();
  if ((this->valLoc).super_type.m_initialized == false) {
    __assert_fail("valLoc",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/tsdl/tsdl-attr.hpp"
                  ,0x70,"TextLocation yactfr::internal::TsdlAttr::valTextLoc() const");
  }
  msg.field_2._8_8_ = in_stack_fffffffffffffe50;
  msg._0_24_ = (this->valLoc).super_type.m_storage.dummy_;
  throwTextParseError(msg,in_stack_fffffffffffffe58);
}

Assistant:

bool TsdlAttr::boolEquiv() const
{
    switch (kind) {
    case Kind::UInt:
        if (uintVal == 1) {
            return true;
        } else if (uintVal == 0) {
            return false;
        }
        break;

    case Kind::Ident:
        if (strVal == "true" || strVal == "TRUE") {
            return true;
        } else if (strVal == "false" || strVal == "FALSE") {
            return false;
        }

    default:
        break;
    }

    std::ostringstream ss;

    ss << "Expecting `0`, `false`, `FALSE`, `1`, `true`, or `TRUE` for `" <<
          name << "` attribute.";
    throwTextParseError(ss.str(), this->valTextLoc());
}